

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O3

void ihevc_weighted_pred_chroma_bi_default
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  UWORD8 UVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  if (0 < ht) {
    uVar3 = 1;
    if (1 < wd * 2) {
      uVar3 = (ulong)(uint)(wd * 2);
    }
    iVar5 = 0;
    do {
      if (0 < wd) {
        uVar4 = 0;
        do {
          iVar2 = (int)pi2_src2[uVar4] + (int)pi2_src1[uVar4] + lvl_shift2 + lvl_shift1 + 0x40 >> 7;
          if (iVar2 < 1) {
            iVar2 = 0;
          }
          UVar1 = (UWORD8)iVar2;
          if (0xfe < iVar2) {
            UVar1 = 0xff;
          }
          pu1_dst[uVar4] = UVar1;
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      pu1_dst = pu1_dst + dst_strd;
      iVar5 = iVar5 + 1;
      pi2_src2 = pi2_src2 + src_strd2;
      pi2_src1 = pi2_src1 + src_strd1;
    } while (iVar5 != ht);
  }
  return;
}

Assistant:

void ihevc_weighted_pred_chroma_bi_default(WORD16 *pi2_src1,
                                           WORD16 *pi2_src2,
                                           UWORD8 *pu1_dst,
                                           WORD32 src_strd1,
                                           WORD32 src_strd2,
                                           WORD32 dst_strd,
                                           WORD32 lvl_shift1,
                                           WORD32 lvl_shift2,
                                           WORD32 ht,
                                           WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;
    WORD32 shift;

    shift = SHIFT_14_MINUS_BIT_DEPTH + 1;
    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            i4_tmp = pi2_src1[col] + lvl_shift1;
            i4_tmp += pi2_src2[col] + lvl_shift2;
            i4_tmp += 1 << (shift - 1);

            pu1_dst[col] = CLIP_U8(i4_tmp >> shift);
        }

        pi2_src1 += src_strd1;
        pi2_src2 += src_strd2;
        pu1_dst += dst_strd;
    }
}